

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

bool __thiscall
runtime::VirtualMachine::variableEquals(VirtualMachine *this,Variable var1,Variable var2)

{
  __type _Var1;
  anon_union_8_6_52c89740_for_Variable_1 __lhs;
  anon_union_8_6_52c89740_for_Variable_1 __rhs;
  bool bVar2;
  string local_40;
  allocator<char> local_19;
  
  __rhs = var2.field_1;
  __lhs = var1.field_1;
  if (var1.type == var2.type) {
    switch(var1._0_8_ & 0xffffffff) {
    case 0:
      bVar2 = true;
      break;
    case 1:
    case 5:
    case 6:
      bVar2 = __lhs.integerValue == __rhs.integerValue;
      break;
    case 2:
      bVar2 = ((var2.field_1._0_4_ ^ var1.field_1._0_4_) & 1) == 0;
      break;
    case 3:
      bVar2 = (bool)(-(__rhs.doubleValue == __lhs.doubleValue) & 1);
      break;
    case 4:
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.objectValue,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs.objectValue);
      return _Var1;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Unknown varible type at variableEquals",&local_19);
      panic(this,&local_40);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool VirtualMachine::variableEquals(Variable var1, Variable var2) {
  if (var1.type != var2.type) {
    return false;
  }

  switch (var1.type) {
    case VariableType::Integer: {
      return var1.integerValue == var2.integerValue;
    }
    case VariableType::Float: {
      return var1.doubleValue == var2.doubleValue;
    }
    case VariableType::Function: {
      return var1.functionValue == var2.functionValue;
    }
    case VariableType::Object: {
      return var1.objectValue == var2.objectValue;
    }
    case VariableType::String: {
      return *var1.stringValue == *var2.stringValue;
    }
    case VariableType::Undefined: {
      return true;
    }
    case VariableType::Boolean: {
      return var1.boolValue == var2.boolValue;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }
}